

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateFieldAccessor
               (FieldDescriptor *field,Options *options,Printer *printer)

{
  uint uVar1;
  ushort *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  OneofDescriptor *pOVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  FieldDescriptor *this;
  EnumDescriptor *pEVar10;
  AlphaNum *b;
  char *pcVar11;
  undefined1 *puVar12;
  Options *pOVar13;
  int32_t extraout_EDX;
  FieldDescriptor *field_00;
  int32_t extraout_EDX_00;
  int32_t extraout_EDX_01;
  int32_t extraout_EDX_02;
  int32_t extraout_EDX_03;
  int32_t extraout_EDX_04;
  int32_t value_01;
  _anonymous_namespace_ *p_Var14;
  AlphaNum *pAVar15;
  undefined1 cap_first_letter;
  undefined1 uVar16;
  undefined1 cap_first_letter_00;
  undefined1 cap_first_letter_01;
  AlphaNum *in_R8;
  anon_union_8_2_3066aaf9_for_type_descriptor_ *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  AlphaNum *in_R9;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view name;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view name_00;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view text_33;
  string_view text_34;
  string_view text_35;
  string_view sVar18;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view value_02;
  string_view input;
  string_view name_06;
  string_view name_07;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view name_08;
  string_view name_09;
  string_view value_03;
  string_view input_00;
  string_view name_10;
  undefined1 local_268 [8];
  undefined1 local_260 [16];
  HeapOrSoo local_250;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_238;
  FieldOptions *local_230;
  Options *local_208;
  allocator<char> local_1f9;
  AlphaNum local_1f8;
  AlphaNum local_1c8;
  OneofDescriptor *local_198;
  string deprecation_trigger_with_conditional;
  string deprecation_trigger;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  size_type local_60;
  pointer local_58;
  int32_t value;
  int32_t value_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  
  local_198 = FieldDescriptor::real_containing_oneof(field);
  b = (AlphaNum *)0x2;
  local_208 = options;
  GenerateFieldDocComment(printer,field,options,2);
  if ((field->options_->field_0)._impl_.deprecated_ == true) {
    _local_268 = absl::lts_20250127::NullSafeStringView("@trigger_error(\'");
    puVar2 = (ushort *)(field->all_names_).payload_;
    local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
    local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
    local_1f8.piece_ =
         absl::lts_20250127::NullSafeStringView(" is deprecated.\', E_USER_DEPRECATED);\n        ");
    b = &local_1f8;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger,(lts_20250127 *)local_268,(AlphaNum *)&local_238,b,in_R8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&deprecation_trigger,"",(allocator<char> *)local_268);
  }
  if ((field->options_->field_0)._impl_.deprecated_ == true) {
    bVar6 = FieldDescriptor::is_repeated(field);
    if (bVar6) {
      _local_268 = absl::lts_20250127::NullSafeStringView("$this->");
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
      local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
      local_1f8.piece_ = absl::lts_20250127::NullSafeStringView("->count() !== 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_150,(lts_20250127 *)local_268,(AlphaNum *)&local_238,&local_1f8,in_R8);
    }
    else {
      pOVar7 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar7 == (OneofDescriptor *)0x0) {
        bVar6 = FieldDescriptor::has_presence(field);
        if (bVar6) {
          _local_268 = absl::lts_20250127::NullSafeStringView("isset($this->");
          puVar2 = (ushort *)(field->all_names_).payload_;
          local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
          local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
          local_1f8.piece_ = absl::lts_20250127::NullSafeStringView(")");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_150,(lts_20250127 *)local_268,(AlphaNum *)&local_238,&local_1f8,in_R8);
        }
        else {
          _local_268 = absl::lts_20250127::NullSafeStringView("$this->");
          puVar2 = (ushort *)(field->all_names_).payload_;
          local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
          local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
          local_1f8.piece_ = absl::lts_20250127::NullSafeStringView(" !== ");
          bVar6 = FieldDescriptor::has_presence(field);
          if (bVar6) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"null",&local_1f9);
          }
          else {
            php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                      (&local_130,(_anonymous_namespace_ *)field,field_00);
          }
          local_1c8.piece_._M_len = local_130._M_string_length;
          local_1c8.piece_._M_str = local_130._M_dataplus._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_150,(lts_20250127 *)local_268,(AlphaNum *)&local_238,&local_1f8,
                     &local_1c8,in_R9);
          std::__cxx11::string::~string((string *)&local_130);
        }
      }
      else {
        _local_268 = absl::lts_20250127::NullSafeStringView("$this->hasOneof(");
        absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&local_238,field->number_);
        local_1f8.piece_ = absl::lts_20250127::NullSafeStringView(")");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_150,(lts_20250127 *)local_268,(AlphaNum *)&local_238,&local_1f8,in_R8);
      }
    }
    std::operator+(&local_110,"if (",&local_150);
    local_60 = local_110._M_string_length;
    local_58 = local_110._M_dataplus._M_p;
    local_90.piece_ = absl::lts_20250127::NullSafeStringView(") {\n            ");
    b = &local_c0;
    local_c0.piece_._M_len = deprecation_trigger._M_string_length;
    local_c0.piece_._M_str = deprecation_trigger._M_dataplus._M_p;
    local_f0.piece_ = absl::lts_20250127::NullSafeStringView("}\n        ");
    pAVar15 = &local_f0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger_with_conditional,(lts_20250127 *)&local_60,&local_90,b,pAVar15,
               in_R9);
    uVar16 = SUB81(pAVar15,0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&deprecation_trigger_with_conditional,"",(allocator<char> *)local_268);
    uVar16 = SUB81(in_R8,0);
  }
  cap_first_letter = SUB81(local_268,0);
  cap_first_letter_00 = SUB81(local_268,0);
  cap_first_letter_01 = SUB81(local_268,0);
  pAVar15 = (AlphaNum *)local_268;
  if (local_198 == (OneofDescriptor *)0x0) {
    bVar6 = FieldDescriptor::has_presence(field);
    if ((bVar6) && (pDVar8 = FieldDescriptor::message_type(field), pDVar8 == (Descriptor *)0x0)) {
      puVar2 = (ushort *)(field->all_names_).payload_;
      p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
      name_08._M_len = (long)puVar2 + ~(ulong)p_Var14;
      name_08._M_str = (char *)b;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var14,name_08,(bool)uVar16);
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_1f8.piece_._M_len = (size_t)*puVar2;
      local_1f8.piece_._M_str = (char *)((long)puVar2 + ~local_1f8.piece_._M_len);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                ((string *)&local_238,(_anonymous_namespace_ *)field,field_02);
      pcVar11 = "camel_name";
      text_19._M_str =
           "public function get^camel_name^()\n{\n    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ : ^default_value^;\n}\n\n"
      ;
      text_19._M_len = 0x7f;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string>
                (printer,text_19,(char (*) [11])0x4e591c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x651c1c,&local_1f8.piece_,(char (*) [14])0x5cd537,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
      std::__cxx11::string::~string((string *)&local_238);
    }
    else {
      puVar2 = (ushort *)(field->all_names_).payload_;
      p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
      name_03._M_len = (long)puVar2 + ~(ulong)p_Var14;
      name_03._M_str = (char *)b;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var14,name_03,(bool)uVar16);
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
      local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
      pcVar11 = "camel_name";
      sVar18._M_str =
           "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->^name^;\n}\n\n"
      ;
      sVar18._M_len = 0x56;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                (printer,sVar18,(char (*) [11])0x4e591c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x651c1c,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                 (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    }
    std::__cxx11::string::~string((string *)local_268);
    bVar6 = FieldDescriptor::has_presence(field);
    if (bVar6) {
      puVar2 = (ushort *)(field->all_names_).payload_;
      p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
      name_04._M_len = (long)puVar2 + ~(ulong)p_Var14;
      name_04._M_str = pcVar11;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var14,name_04,(bool)cap_first_letter_00);
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_1f8.piece_._M_len = (size_t)*puVar2;
      local_1f8.piece_._M_str = (char *)((long)puVar2 + ~local_1f8.piece_._M_len);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                ((string *)&local_238,(_anonymous_namespace_ *)field,field_01);
      text_01._M_str =
           "public function has^camel_name^()\n{\n    ^deprecation_trigger_with_conditional^return isset($this->^name^);\n}\n\npublic function clear^camel_name^()\n{\n    ^deprecation_trigger^unset($this->^name^);\n}\n\n"
      ;
      text_01._M_len = 0xc6;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string,char[37],std::__cxx11::string>
                (printer,text_01,(char (*) [11])0x4e591c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x651c1c,&local_1f8.piece_,(char (*) [14])0x5cd537,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 (char (*) [20])"deprecation_trigger",&deprecation_trigger,
                 (char (*) [37])"deprecation_trigger_with_conditional",
                 &deprecation_trigger_with_conditional);
      goto LAB_00186721;
    }
  }
  else {
    puVar2 = (ushort *)(field->all_names_).payload_;
    p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
    name_01._M_len = (long)puVar2 + ~(ulong)p_Var14;
    name_01._M_str = (char *)b;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var14,name_01,(bool)uVar16);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value);
    pcVar11 = "camel_name";
    text._M_str = 
    "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->readOneof(^number^);\n}\n\n"
    ;
    text._M_len = 99;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,text,(char (*) [11])0x4e591c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [7])0x619666,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
               (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_268);
    puVar2 = (ushort *)(field->all_names_).payload_;
    p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
    name_02._M_len = (long)puVar2 + ~(ulong)p_Var14;
    name_02._M_str = pcVar11;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var14,name_02,(bool)cap_first_letter);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value_00);
    text_00._M_str =
         "public function has^camel_name^()\n{\n    ^deprecation_trigger^return $this->hasOneof(^number^);\n}\n\n"
    ;
    text_00._M_len = 0x62;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              (printer,text_00,(char (*) [11])0x4e591c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [7])0x619666,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
               (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
LAB_00186721:
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_268);
  }
  bVar6 = FieldDescriptor::is_map(field);
  if ((((!bVar6) && (bVar6 = FieldDescriptor::is_repeated(field), !bVar6)) &&
      (puVar12 = FieldDescriptor::kTypeToCppTypeMap,
      *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) &&
     (bVar6 = IsWrapperType(field), bVar6)) {
    pDVar8 = FieldDescriptor::message_type(field);
    name._M_str = "value";
    name._M_len = 5;
    pFVar9 = Descriptor::FindFieldByName(pDVar8,name);
    text_02._M_str = "/**\n";
    text_02._M_len = 4;
    io::Printer::Print<>(printer,text_02);
    puVar2 = (ushort *)(field->all_names_).payload_;
    p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
    name_05._M_len = (long)puVar2 + ~(ulong)p_Var14;
    name_05._M_str = puVar12;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var14,name_05,(bool)cap_first_letter_00);
    pcVar11 = "camel_name";
    text_03._M_str = " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n";
    text_03._M_len = 0x42;
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,text_03,(char (*) [11])0x4e591c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    std::__cxx11::string::~string((string *)local_268);
    GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
    FieldDescriptor::DebugString_abi_cxx11_((string *)&local_1f8,field);
    value_02._M_str = pcVar11;
    value_02._M_len = local_1f8.piece_._M_len;
    php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)local_1f8.piece_._M_str,value_02);
    input._M_str = pcVar11;
    input._M_len = (size_t)local_238.message_type;
    php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
              ((string *)local_268,(_anonymous_namespace_ *)local_230,input);
    pOVar13 = (Options *)0x49651b;
    text_04._M_str = " * Generated from protobuf field <code>^def^</code>\n";
    text_04._M_len = 0x34;
    io::Printer::Print<char[4],std::__cxx11::string>
              (printer,text_04,(char (*) [4])0x49651b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    auVar3._13_3_ = 0;
    auVar3._0_13_ = stack0xfffffffffffffd9b;
    _local_268 = (string_view)(auVar3 << 0x18);
    local_260._8_8_ = 0;
    local_250.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    _local_268 = (string_view)(ZEXT616(local_268._2_6_) << 0x10);
    php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)pFVar9,(FieldDescriptor *)local_268,
               pOVar13);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_260);
    pcVar11 = "php_type";
    paVar17 = &local_238;
    text_05._M_str = " * @return ^php_type^|null\n";
    text_05._M_len = 0x1b;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_05,(char (*) [9])"php_type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar17);
    uVar16 = SUB81(paVar17,0);
    std::__cxx11::string::~string((string *)&local_238);
    text_06._M_str = " */\n";
    text_06._M_len = 4;
    io::Printer::Print<>(printer,text_06);
    puVar2 = (ushort *)(field->all_names_).payload_;
    p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
    name_06._M_len = (long)puVar2 + ~(ulong)p_Var14;
    name_06._M_str = pcVar11;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var14,name_06,(bool)uVar16);
    puVar2 = (ushort *)(field->all_names_).payload_;
    local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
    local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
    text_07._M_str =
         "public function get^camel_name^Unwrapped()\n{\n    ^deprecation_trigger^return $this->readWrapperValue(\"^field_name^\");\n}\n\n"
    ;
    text_07._M_len = 0x79;
    cap_first_letter_00 = (char)local_268;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
              (printer,text_07,(char (*) [11])0x4e591c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [11])0x501fba,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_238,
               (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
    std::__cxx11::string::~string((string *)local_268);
  }
  pcVar11 = (char *)0x1;
  GenerateFieldDocComment(printer,field,local_208,1);
  puVar2 = (ushort *)(field->all_names_).payload_;
  p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
  name_07._M_len = (long)puVar2 + ~(ulong)p_Var14;
  name_07._M_str = pcVar11;
  php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_268,p_Var14,name_07,(bool)cap_first_letter_00);
  pcVar11 = "camel_name";
  text_08._M_str = "public function set^camel_name^($var)\n{\n";
  text_08._M_len = 0x28;
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,text_08,(char (*) [11])0x4e591c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  if ((((field->options_->field_0)._impl_.deprecated_ == true) &&
      (bVar6 = FieldDescriptor::is_map(field), !bVar6)) &&
     (bVar6 = FieldDescriptor::is_repeated(field), !bVar6)) {
    pcVar11 = "deprecation_trigger";
    args_1 = &deprecation_trigger;
    text_09._M_str = "^deprecation_trigger^";
    text_09._M_len = 0x15;
    io::Printer::Print<char[20],std::__cxx11::string>
              (printer,text_09,(char (*) [20])"deprecation_trigger",args_1);
    cap_first_letter_01 = SUB81(args_1,0);
  }
  bVar6 = FieldDescriptor::is_map(field);
  if (bVar6) {
    pDVar8 = FieldDescriptor::message_type(field);
    pFVar9 = Descriptor::map_key(pDVar8);
    this = Descriptor::map_value(pDVar8);
    sVar18 = FieldDescriptor::type_name(pFVar9);
    s._M_len = sVar18._M_str;
    s._M_str = pcVar11;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)local_268,(lts_20250127 *)sVar18._M_len,s);
    sVar18 = FieldDescriptor::type_name(this);
    s_00._M_len = sVar18._M_str;
    s_00._M_str = pcVar11;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)&local_238,(lts_20250127 *)sVar18._M_len,s_00);
    text_10._M_str =
         "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
    ;
    text_10._M_len = 0x82;
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text_10,(char (*) [9])0x5546f6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [11])0x5547eb,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_268);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 8) {
      pEVar10 = FieldDescriptor::enum_type(this);
      FullClassName<google::protobuf::EnumDescriptor>((string *)&local_1c8,pEVar10,local_208);
      local_260._0_8_ = local_1c8.piece_._M_len;
      local_268 = (undefined1  [8])local_1c8.piece_._M_str;
      _local_238 = absl::lts_20250127::NullSafeStringView("::class");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1f8,(lts_20250127 *)local_268,(AlphaNum *)&local_238,
                 (AlphaNum *)&local_238);
      text_15._M_str = ", \\^class_name^);\n";
      text_15._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_15,(char (*) [11])0x575cfb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
    }
    else {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) != 10) {
        text_16._M_str = ");\n";
        text_16._M_len = 3;
        io::Printer::Print<>(printer,text_16);
        value_01 = extraout_EDX;
        goto LAB_00186f00;
      }
      pDVar8 = FieldDescriptor::message_type(this);
      FullClassName<google::protobuf::Descriptor>((string *)&local_1c8,pDVar8,local_208);
      local_260._0_8_ = local_1c8.piece_._M_len;
      local_268 = (undefined1  [8])local_1c8.piece_._M_str;
      _local_238 = absl::lts_20250127::NullSafeStringView("::class");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_1f8,(lts_20250127 *)local_268,(AlphaNum *)&local_238,
                 (AlphaNum *)&local_238);
      text_11._M_str = ", \\^class_name^);\n";
      text_11._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_11,(char (*) [11])0x575cfb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
    }
LAB_00186d91:
    std::__cxx11::string::~string((string *)&local_1f8);
    pAVar15 = &local_1c8;
  }
  else {
    bVar6 = FieldDescriptor::is_repeated(field);
    if (bVar6) {
      sVar18 = FieldDescriptor::type_name(field);
      s_01._M_len = sVar18._M_str;
      s_01._M_str = pcVar11;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
                ((string *)local_268,(lts_20250127 *)sVar18._M_len,s_01);
      text_12._M_str =
           "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^";
      text_12._M_len = 0x52;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text_12,(char (*) [5])0x61655a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      std::__cxx11::string::~string((string *)local_268);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 8) {
        pEVar10 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>((string *)&local_1c8,pEVar10,local_208);
        local_260._0_8_ = local_1c8.piece_._M_len;
        local_268 = (undefined1  [8])local_1c8.piece_._M_str;
        _local_238 = absl::lts_20250127::NullSafeStringView("::class");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_1f8,(lts_20250127 *)local_268,(AlphaNum *)&local_238,
                   (AlphaNum *)&local_238);
        text_17._M_str = ", \\^class_name^);\n";
        text_17._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_17,(char (*) [11])0x575cfb,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      }
      else {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          text_18._M_str = ");\n";
          text_18._M_len = 3;
          io::Printer::Print<>(printer,text_18);
          value_01 = extraout_EDX_00;
          goto LAB_00186f00;
        }
        pDVar8 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>((string *)&local_1c8,pDVar8,local_208);
        local_260._0_8_ = local_1c8.piece_._M_len;
        local_268 = (undefined1  [8])local_1c8.piece_._M_str;
        _local_238 = absl::lts_20250127::NullSafeStringView("::class");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_1f8,(lts_20250127 *)local_268,(AlphaNum *)&local_238,
                   (AlphaNum *)&local_238);
        text_13._M_str = ", \\^class_name^);\n";
        text_13._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_13,(char (*) [11])0x575cfb,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      }
      goto LAB_00186d91;
    }
    uVar1 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    pcVar11 = (char *)(ulong)uVar1;
    if (uVar1 == 8) {
      pEVar10 = FieldDescriptor::enum_type(field);
      FullClassName<google::protobuf::EnumDescriptor>((string *)local_268,pEVar10,local_208);
      text_21._M_str = "GPBUtil::checkEnum($var, \\^class_name^::class);\n";
      text_21._M_len = 0x30;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_21,(char (*) [11])0x575cfb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    }
    else {
      if (uVar1 == 9) {
        pcVar11 = "False";
        if (field->type_ == 9) {
          pcVar11 = "True";
        }
        local_268 = (undefined1  [8])pcVar11;
        text_20._M_str = "GPBUtil::checkString($var, ^utf8^);\n";
        text_20._M_len = 0x24;
        io::Printer::Print<char[5],char_const*>
                  (printer,text_20,(char (*) [5])0x56d96c,(char **)local_268);
        value_01 = extraout_EDX_01;
        goto LAB_00186f00;
      }
      if (uVar1 == 10) {
        pDVar8 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>((string *)local_268,pDVar8,local_208);
        text_14._M_str = "GPBUtil::checkMessage($var, \\^class_name^::class);\n";
        text_14._M_len = 0x33;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_14,(char (*) [11])0x575cfb,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        pAVar15 = (AlphaNum *)local_268;
      }
      else {
        sVar18 = FieldDescriptor::cpp_type_name(field);
        name_09._M_len = sVar18._M_str;
        name_09._M_str = pcVar11;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_268,(_anonymous_namespace_ *)sVar18._M_len,name_09,
                   (bool)cap_first_letter_01);
        text_22._M_str = "GPBUtil::check^type^($var);\n";
        text_22._M_len = 0x1c;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_22,(char (*) [5])0x61655a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        pAVar15 = (AlphaNum *)local_268;
      }
    }
  }
  std::__cxx11::string::~string((string *)pAVar15);
  value_01 = extraout_EDX_02;
LAB_00186f00:
  if (((field->options_->field_0)._impl_.deprecated_ == true) &&
     ((bVar6 = FieldDescriptor::is_map(field), bVar6 ||
      (bVar6 = FieldDescriptor::is_repeated(field), value_01 = extraout_EDX_03, bVar6)))) {
    text_23._M_str = "if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n";
    text_23._M_len = 0x36;
    io::Printer::Print<char[20],std::__cxx11::string>
              (printer,text_23,(char (*) [20])"deprecation_trigger",&deprecation_trigger);
    value_01 = extraout_EDX_04;
  }
  if (local_198 == (OneofDescriptor *)0x0) {
    bVar6 = FieldDescriptor::is_repeated(field);
    if (bVar6) {
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_268 = (undefined1  [8])(ulong)*puVar2;
      local_260._0_8_ = (char *)((long)puVar2 + ~(ulong)local_268);
      text_25._M_str = "$this->^name^ = $arr;\n";
      text_25._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,text_25,(char (*) [5])0x651c1c,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_268);
    }
    else {
      puVar2 = (ushort *)(field->all_names_).payload_;
      local_268 = (undefined1  [8])(ulong)*puVar2;
      local_260._0_8_ = (char *)((long)puVar2 + ~(ulong)local_268);
      text_26._M_str = "$this->^name^ = $var;\n";
      text_26._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                (printer,text_26,(char (*) [5])0x651c1c,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_268);
    }
  }
  else {
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)local_268,(_anonymous_namespace_ *)(ulong)(uint)field->number_,value_01);
    text_24._M_str = "$this->writeOneof(^number^, $var);\n";
    text_24._M_len = 0x23;
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,text_24,(char (*) [7])0x619666,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    std::__cxx11::string::~string((string *)local_268);
  }
  text_27._M_str = "\nreturn $this;\n";
  text_27._M_len = 0xf;
  io::Printer::Print<>(printer,text_27);
  Outdent(printer);
  text_28._M_str = "}\n\n";
  text_28._M_len = 3;
  io::Printer::Print<>(printer,text_28);
  bVar6 = FieldDescriptor::is_map(field);
  if ((((!bVar6) && (bVar6 = FieldDescriptor::is_repeated(field), !bVar6)) &&
      (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) &&
     (bVar6 = IsWrapperType(field), bVar6)) {
    pDVar8 = FieldDescriptor::message_type(field);
    name_00._M_str = "value";
    name_00._M_len = 5;
    pFVar9 = Descriptor::FindFieldByName(pDVar8,name_00);
    text_29._M_str = "/**\n";
    text_29._M_len = 4;
    io::Printer::Print<>(printer,text_29);
    pDVar8 = FieldDescriptor::message_type(field);
    auVar4._13_3_ = 0;
    auVar4._0_13_ = stack0xfffffffffffffd9b;
    _local_268 = (string_view)(auVar4 << 0x18);
    local_260._8_8_ = 0;
    local_250.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    _local_268 = (string_view)(ZEXT616(local_268._2_6_) << 0x10);
    FullClassName<google::protobuf::Descriptor>((string *)&local_238,pDVar8,(Options *)local_268);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_260);
    pcVar11 = "message_name";
    text_30._M_str =
         " * Sets the field by wrapping a primitive type in a ^message_name^ object.\n\n";
    text_30._M_len = 0x4c;
    io::Printer::Print<char[13],std::__cxx11::string>
              (printer,text_30,(char (*) [13])"message_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
    FieldDescriptor::DebugString_abi_cxx11_((string *)&local_1f8,field);
    value_03._M_str = pcVar11;
    value_03._M_len = local_1f8.piece_._M_len;
    php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)local_1f8.piece_._M_str,value_03);
    input_00._M_str = pcVar11;
    input_00._M_len = (size_t)local_238.message_type;
    php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
              ((string *)local_268,(_anonymous_namespace_ *)local_230,input_00);
    pOVar13 = (Options *)0x49651b;
    text_31._M_str = " * Generated from protobuf field <code>^def^</code>\n";
    text_31._M_len = 0x34;
    io::Printer::Print<char[4],std::__cxx11::string>
              (printer,text_31,(char (*) [4])0x49651b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    auVar5._13_3_ = 0;
    auVar5._0_13_ = stack0xfffffffffffffd9b;
    _local_268 = (string_view)(auVar5 << 0x18);
    local_260._8_8_ = 0;
    local_250.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    _local_268 = (string_view)(ZEXT616(local_268._2_6_) << 0x10);
    php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
              ((string *)&local_238,(_anonymous_namespace_ *)pFVar9,(FieldDescriptor *)local_268,
               pOVar13);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_260);
    pcVar11 = "php_type";
    paVar17 = &local_238;
    text_32._M_str = " * @param ^php_type^|null $var\n";
    text_32._M_len = 0x1f;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_32,(char (*) [9])"php_type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar17);
    uVar16 = SUB81(paVar17,0);
    std::__cxx11::string::~string((string *)&local_238);
    text_33._M_str = " * @return $this\n";
    text_33._M_len = 0x11;
    io::Printer::Print<>(printer,text_33);
    text_34._M_str = " */\n";
    text_34._M_len = 4;
    io::Printer::Print<>(printer,text_34);
    puVar2 = (ushort *)(field->all_names_).payload_;
    p_Var14 = (_anonymous_namespace_ *)(ulong)*puVar2;
    name_10._M_len = (long)puVar2 + ~(ulong)p_Var14;
    name_10._M_str = pcVar11;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var14,name_10,(bool)uVar16);
    puVar2 = (ushort *)(field->all_names_).payload_;
    local_238 = (anon_union_8_2_3066aaf9_for_type_descriptor_)(ulong)*puVar2;
    local_230 = (FieldOptions *)((long)puVar2 + ~(ulong)local_238.message_type);
    text_35._M_str =
         "public function set^camel_name^Unwrapped($var)\n{\n    $this->writeWrapperValue(\"^field_name^\", $var);\n    return $this;}\n\n"
    ;
    text_35._M_len = 0x79;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_35,(char (*) [11])0x4e591c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [11])0x501fba,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_238);
    std::__cxx11::string::~string((string *)local_268);
  }
  std::__cxx11::string::~string((string *)&deprecation_trigger_with_conditional);
  std::__cxx11::string::~string((string *)&deprecation_trigger);
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, const Options& options,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->real_containing_oneof();

  // Generate getter.
  GenerateFieldDocComment(printer, field, options, kFieldGetter);

  // deprecation
  std::string deprecation_trigger =
      (field->options().deprecated())
          ? absl::StrCat("@trigger_error('", field->name(),
                         " is deprecated.', E_USER_DEPRECATED);\n        ")
          : "";
  std::string deprecation_trigger_with_conditional =
      (field->options().deprecated())
          ? absl::StrCat("if (" + DeprecatedConditionalForField(field),
                         ") {\n            ", deprecation_trigger,
                         "}\n        ")
          : "";

  // Emit getter.
  if (oneof != nullptr) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence() && !field->message_type()) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ "
        ": ^default_value^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger_with_conditional);
  } else {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Emit hazzers/clear.
  if (oneof) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->hasOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence()) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger_with_conditional^return isset($this->^name^);"
        "\n}\n\n"
        "public function clear^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^unset($this->^name^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger,
        "deprecation_trigger_with_conditional",
        deprecation_trigger_with_conditional);
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    ^deprecation_trigger^return "
        "$this->readWrapperValue(\"^field_name^\");\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, options, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  if (field->options().deprecated() && !field->is_map() &&
      !field->is_repeated()) {
    printer->Print("^deprecation_trigger^", "deprecation_trigger",
                   deprecation_trigger);
  }

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->map_key();
    const FieldDescriptor* value = map_entry->map_value();
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", absl::AsciiStrToUpper(key->type_name()), "value_type",
        absl::AsciiStrToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(value->message_type(), options),
                                  "::class"));
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(value->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", absl::AsciiStrToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(field->message_type(), options),
                                  "::class"));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(field->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print("GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->message_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print("GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->enum_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n", "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True" : "False");
  } else {
    printer->Print("GPBUtil::check^type^($var);\n", "type",
                   UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (field->options().deprecated() &&
      (field->is_map() || field->is_repeated())) {
    printer->Print("if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n",
                   "deprecation_trigger", deprecation_trigger);
  }

  if (oneof != nullptr) {
    printer->Print("$this->writeOneof(^number^, $var);\n", "number",
                   IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print("$this->^name^ = $arr;\n", "name", field->name());
  } else {
    printer->Print("$this->^name^ = $var;\n", "name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print("}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $this->writeWrapperValue(\"^field_name^\", $var);\n"
        "    return $this;"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name());
  }
}